

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void game_loop_unix(int control)

{
  char *argument;
  undefined2 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  DESCRIPTOR_DATA *pDVar9;
  CHAR_DATA *pCVar10;
  int *piVar11;
  short sVar12;
  short sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  PC_DATA *pPVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  DESCRIPTOR_DATA *pDVar21;
  string_view fmt;
  string_view fmt_00;
  timeval last_time;
  timeval now_time;
  timeval stall_time;
  fd_set in_set;
  fd_set out_set;
  fd_set exc_set;
  timeval local_1f8;
  ulong local_1e8;
  timeval local_1e0;
  timeval local_1d0;
  char *local_1c0;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  uVar15 = (ulong)(uint)control;
  signal(0xd,(__sighandler_t)0x1);
  gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
  current_time = CONCAT44(local_1f8.tv_sec._4_4_,(int)local_1f8.tv_sec);
  if (merc_down == false) {
    iVar7 = control + 0x3f;
    if (-1 < control) {
      iVar7 = control;
    }
    uVar19 = 1L << ((byte)control & 0x3f);
    local_1e8 = uVar15;
    do {
      local_1b8.fds_bits[0] = 0;
      local_1b8.fds_bits[1] = 0;
      local_1b8.fds_bits[2] = 0;
      local_1b8.fds_bits[3] = 0;
      local_1b8.fds_bits[4] = 0;
      local_1b8.fds_bits[5] = 0;
      local_1b8.fds_bits[6] = 0;
      local_1b8.fds_bits[7] = 0;
      local_1b8.fds_bits[8] = 0;
      local_1b8.fds_bits[9] = 0;
      local_1b8.fds_bits[10] = 0;
      local_1b8.fds_bits[0xb] = 0;
      local_1b8.fds_bits[0xc] = 0;
      local_1b8.fds_bits[0xd] = 0;
      local_1b8.fds_bits[0xe] = 0;
      local_1b8.fds_bits[0xf] = 0;
      local_138.fds_bits[0] = 0;
      local_138.fds_bits[1] = 0;
      local_138.fds_bits[2] = 0;
      local_138.fds_bits[3] = 0;
      local_138.fds_bits[4] = 0;
      local_138.fds_bits[5] = 0;
      local_138.fds_bits[6] = 0;
      local_138.fds_bits[7] = 0;
      local_138.fds_bits[8] = 0;
      local_138.fds_bits[9] = 0;
      local_138.fds_bits[10] = 0;
      local_138.fds_bits[0xb] = 0;
      local_138.fds_bits[0xc] = 0;
      local_138.fds_bits[0xd] = 0;
      local_138.fds_bits[0xe] = 0;
      local_138.fds_bits[0xf] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_1b8.fds_bits[iVar7 >> 6] = local_1b8.fds_bits[iVar7 >> 6] | uVar19;
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      iVar8 = (int)uVar15;
      if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
        uVar16 = uVar15 & 0xffffffff;
        pDVar9 = descriptor_list;
        do {
          sVar12 = pDVar9->descriptor;
          if ((int)uVar16 <= (int)sVar12) {
            uVar16 = (ulong)(uint)(int)sVar12;
          }
          iVar8 = (int)uVar16;
          sVar13 = sVar12 + 0x3f;
          if (-1 < sVar12) {
            sVar13 = sVar12;
          }
          uVar14 = 1L << ((byte)sVar12 & 0x3f);
          sVar12 = (short)((uint)(int)sVar13 >> 6);
          local_1b8.fds_bits[sVar12] = local_1b8.fds_bits[sVar12] | uVar14;
          local_138.fds_bits[sVar12] = local_138.fds_bits[sVar12] | uVar14;
          local_b8.fds_bits[sVar12] = local_b8.fds_bits[sVar12] | uVar14;
          pDVar9 = pDVar9->next;
        } while (pDVar9 != (DESCRIPTOR_DATA *)0x0);
      }
      iVar8 = select(iVar8 + 1,&local_1b8,&local_138,&local_b8,(timeval *)&game_loop_unix::null_time
                    );
      if (iVar8 < 0) {
        piVar11 = __errno_location();
        local_1e0.tv_sec = (__time_t)strerror(*piVar11);
        fmt._M_str = "Game_loop: select poll: {}";
        fmt._M_len = 0x1a;
        CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt,(char **)&local_1e0);
        exit(0);
      }
      if ((local_1b8.fds_bits[iVar7 >> 6] & uVar19) != 0) {
        init_descriptor((int)uVar15);
      }
      pDVar9 = descriptor_list;
      if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
        do {
          d_next = pDVar9->next;
          uVar2._0_2_ = pDVar9->descriptor;
          uVar2._2_2_ = pDVar9->connected;
          sVar12 = (undefined2)uVar2 + 0x3f;
          if (-1 < (short)(undefined2)uVar2) {
            sVar12 = (undefined2)uVar2;
          }
          sVar12 = (short)((uint)(int)sVar12 >> 6);
          if (((ulong)local_b8.fds_bits[sVar12] >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
            uVar16 = ~(1L << ((byte)(undefined2)uVar2 & 0x3f));
            local_1b8.fds_bits[sVar12] = local_1b8.fds_bits[sVar12] & uVar16;
            local_138.fds_bits[sVar12] = local_138.fds_bits[sVar12] & uVar16;
            pCVar10 = pDVar9->character;
            if ((pCVar10 != (CHAR_DATA *)0x0) && (1 < pCVar10->level)) {
              save_char_obj(pCVar10);
            }
            pDVar9->outtop = 0;
            close_socket(pDVar9);
          }
          pDVar21 = descriptor_list;
          pDVar9 = d_next;
        } while (d_next != (DESCRIPTOR_DATA *)0x0);
LAB_002737b9:
        pDVar9 = pDVar21;
        if (pDVar9 != (DESCRIPTOR_DATA *)0x0) {
          d_next = pDVar9->next;
          pDVar9->fcommand = false;
          uVar3._0_2_ = pDVar9->descriptor;
          uVar3._2_2_ = pDVar9->connected;
          sVar12 = (undefined2)uVar3 + 0x3f;
          if (-1 < (short)(undefined2)uVar3) {
            sVar12 = (undefined2)uVar3;
          }
          if (((ulong)local_1b8.fds_bits[(short)((uint)(int)sVar12 >> 6)] >> ((ulong)uVar3 & 0x3f) &
              1) != 0) {
            if (pDVar9->character != (CHAR_DATA *)0x0) {
              pDVar9->character->timer = 0;
            }
            bVar6 = read_from_descriptor(pDVar9);
            if (!bVar6) {
              uVar1 = pDVar9->descriptor;
              bVar5 = (byte)uVar1 & 0x3f;
              sVar12 = uVar1 + 0x3f;
              if (-1 < (short)uVar1) {
                sVar12 = uVar1;
              }
              local_138.fds_bits[(short)((uint)(int)sVar12 >> 6)] =
                   local_138.fds_bits[(short)((uint)(int)sVar12 >> 6)] &
                   (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
              pCVar10 = pDVar9->character;
              if ((pCVar10 != (CHAR_DATA *)0x0) && (1 < pCVar10->level)) {
                save_char_obj(pCVar10);
              }
              pDVar9->outtop = 0;
              close_socket(pDVar9);
              pDVar21 = d_next;
              goto LAB_002737b9;
            }
          }
          pCVar10 = pDVar9->character;
          if ((pCVar10 == (CHAR_DATA *)0x0) ||
             (((sVar12 = pCVar10->wait, 0 < sVar12 && (pCVar10->wait = sVar12 + -1, sVar12 != 1)) ||
              (pCVar10->pcdata->pending != true)))) {
            read_from_buffer(pDVar9);
            pDVar21 = d_next;
            if (pDVar9->incomm[0] != '\0') {
              argument = pDVar9->incomm;
              pDVar9->fcommand = true;
              stop_idling(pDVar9->character);
              if (pDVar9->showstr_point == (char *)0x0) {
                if (pDVar9->pString == (char **)0x0) {
                  if (pDVar9->connected == 0) {
                    pPVar17 = pDVar9->character->pcdata;
                    if ((pPVar17 == (PC_DATA *)0x0) || (pPVar17->entering_text != true)) {
                      bVar6 = run_olc_editor(pDVar9);
                      if (!bVar6) {
                        substitute_alias(pDVar9,argument);
                      }
                    }
                    else {
                      process_text(pDVar9->character,argument);
                    }
                  }
                  else {
                    nanny(pDVar9,argument);
                  }
                }
                else {
                  string_add(pDVar9->character,argument);
                }
              }
              else {
                show_string(pDVar9,argument);
              }
              *argument = '\0';
              pDVar21 = d_next;
            }
          }
          else {
            interpret(pCVar10,pCVar10->pcdata->queue[0]);
            pCVar10 = pDVar9->character;
            pDVar21 = d_next;
            if (pCVar10 != (CHAR_DATA *)0x0) {
              pPVar17 = pCVar10->pcdata;
              sVar12 = pPVar17->write_next;
              if (1 < sVar12) {
                lVar18 = 1;
                lVar20 = 0x1f6e;
                do {
                  strcpy((char *)((long)pPVar17 + lVar20 + -0x1200),
                         (char *)((long)&pPVar17->next + lVar20));
                  lVar18 = lVar18 + 1;
                  pCVar10 = pDVar9->character;
                  pPVar17 = pCVar10->pcdata;
                  sVar12 = pPVar17->write_next;
                  lVar20 = lVar20 + 0x1200;
                  uVar15 = local_1e8;
                } while (lVar18 < sVar12);
              }
              sVar12 = sVar12 + -1;
              pPVar17->write_next = sVar12;
              if (sVar12 < 0x14) {
                lVar20 = (long)sVar12 * 0x1200 + 0xd6e;
                lVar18 = (long)sVar12 + -0x14;
                do {
                  *(undefined1 *)((long)&pDVar9->character->pcdata->next + lVar20) = 0;
                  lVar20 = lVar20 + 0x1200;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 0);
                pCVar10 = pDVar9->character;
              }
              pDVar21 = d_next;
              if (pCVar10->pcdata->write_next == 0) {
                pCVar10->pcdata->pending = false;
                pDVar21 = d_next;
              }
            }
          }
          goto LAB_002737b9;
        }
      }
      update_handler();
      pDVar9 = descriptor_list;
      while (pDVar21 = pDVar9, pDVar21 != (DESCRIPTOR_DATA *)0x0) {
        d_next = pDVar21->next;
        pDVar9 = d_next;
        if ((pDVar21->fcommand != false) || (0 < pDVar21->outtop)) {
          uVar4._0_2_ = pDVar21->descriptor;
          uVar4._2_2_ = pDVar21->connected;
          sVar12 = (undefined2)uVar4 + 0x3f;
          if (-1 < (short)(undefined2)uVar4) {
            sVar12 = (undefined2)uVar4;
          }
          if ((((ulong)local_138.fds_bits[(short)((uint)(int)sVar12 >> 6)] >> ((ulong)uVar4 & 0x3f)
               & 1) != 0) && (bVar6 = process_output(pDVar21,true), pDVar9 = d_next, !bVar6)) {
            pCVar10 = pDVar21->character;
            if ((pCVar10 != (CHAR_DATA *)0x0) && (1 < pCVar10->level)) {
              save_char_obj(pCVar10);
            }
            pDVar21->outtop = 0;
            close_socket(pDVar21);
            pDVar9 = d_next;
          }
        }
      }
      gettimeofday(&local_1e0,(__timezone_ptr_t)0x0);
      uVar16 = (ulong)(((int)local_1f8.tv_usec - (int)local_1e0.tv_usec) + 250000);
      lVar18 = (long)((int)local_1f8.tv_sec - (int)local_1e0.tv_sec);
      if ((long)uVar16 < 0) {
        uVar14 = 0xfffffffffff0bdc0;
        if (0xfffffffffff0bdc0 < uVar16) {
          uVar14 = uVar16;
        }
        uVar14 = ((uVar14 - uVar16) - (ulong)(uVar16 < 0xfffffffffff0bdc0)) / 1000000 +
                 (ulong)(uVar16 < 0xfffffffffff0bdc0);
        uVar16 = uVar16 + 1000000 + uVar14 * 1000000;
        lVar18 = lVar18 + ~uVar14;
      }
      if (999999 < uVar16) {
        uVar14 = (uVar16 - 1000000) / 1000000;
        uVar16 = (uVar16 + uVar14 * -1000000) - 1000000;
        lVar18 = lVar18 + uVar14 + 1;
      }
      if (((0 < lVar18) || ((lVar18 == 0 && (uVar16 != 0)))) &&
         (local_1d0.tv_sec = lVar18, local_1d0.tv_usec = uVar16,
         iVar8 = select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,&local_1d0), iVar8 < 0)) {
        piVar11 = __errno_location();
        local_1c0 = strerror(*piVar11);
        fmt_00._M_str = "Game_loop: select stall: {}";
        fmt_00._M_len = 0x1b;
        CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt_00,&local_1c0);
        exit(1);
      }
      gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
      current_time = CONCAT44(local_1f8.tv_sec._4_4_,(int)local_1f8.tv_sec);
    } while (merc_down != true);
  }
  return;
}

Assistant:

void game_loop_unix(int control)
{
	static struct timeval null_time;
	struct timeval last_time;

	signal(SIGPIPE, SIG_IGN);
	gettimeofday(&last_time, nullptr);
	current_time = (time_t)last_time.tv_sec;

	/* Main loop */
	while (!merc_down)
	{
		fd_set in_set;
		fd_set out_set;
		fd_set exc_set;
		DESCRIPTOR_DATA *d;
		int maxdesc;

#ifdef MALLOC_DEBUG
		if (malloc_verify() != 1)
			abort();
#endif

		/*
		 * Poll all active descriptors.
		 */
		FD_ZERO(&in_set);
		FD_ZERO(&out_set);
		FD_ZERO(&exc_set);
		FD_SET(control, &in_set);

		maxdesc = control;

		for (d = descriptor_list; d; d = d->next)
		{
			maxdesc = std::max(maxdesc, (int)d->descriptor);
			FD_SET(d->descriptor, &in_set);
			FD_SET(d->descriptor, &out_set);
			FD_SET(d->descriptor, &exc_set);
		}

		if (select(maxdesc + 1, &in_set, &out_set, &exc_set, &null_time) < 0)
		{
			RS.Logger.Error("Game_loop: select poll: {}", std::strerror(errno));
			exit(0);
		}

		/*
		 * New connection?
		 */
		if (FD_ISSET(control, &in_set))
			init_descriptor(control);

		/*
		 * Kick out the freaky folks.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;

			if (FD_ISSET(d->descriptor, &exc_set))
			{
				FD_CLR(d->descriptor, &in_set);
				FD_CLR(d->descriptor, &out_set);

				if (d->character && d->character->level > 1)
					save_char_obj(d->character);

				d->outtop = 0;
				close_socket(d);
			}
		}

		/*
		 * Process input.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;
			d->fcommand= false;

			if (FD_ISSET(d->descriptor, &in_set))
			{
				if (d->character != nullptr)
					d->character->timer = 0;

				if (!read_from_descriptor(d))
				{
					FD_CLR(d->descriptor, &out_set);

					if (d->character != nullptr && d->character->level > 1)
						save_char_obj(d->character);

					d->outtop = 0;
					close_socket(d);
					continue;
				}
			}

			if (d->character != nullptr && d->character->wait > 0)
				--d->character->wait;

			if (d->character != nullptr && d->character->wait <= 0 && d->character->pcdata->pending)
			{
				int i = 0;
				interpret(d->character, d->character->pcdata->queue[0]);

				if (!d->character) // Cal: Silly Morglum.  But what if we just interpreted a "quit"?
					continue;	   // then d->character is null and we just crashed. :(

				for (i = 1; i < d->character->pcdata->write_next; i++)
				{
					strcpy(d->character->pcdata->queue[(i - 1)], d->character->pcdata->queue[i]);
				}

				d->character->pcdata->write_next--;

				for (i = d->character->pcdata->write_next; i < MAX_QUEUE; i++)
				{
					d->character->pcdata->queue[i][0] = '\0';
				}

				if (d->character->pcdata->write_next == 0)
					d->character->pcdata->pending= false;

				continue;
				/*
					d->character->pcdata->queue[d->character->pcdata->read_next][0] = '\0';
					d->character->pcdata->read_next++;

					if (d->character->pcdata->read_next > 19)
						d->character->pcdata->read_next = 0;
					if (d->character->pcdata->queue[d->character->pcdata->read_next][0] == '\0')
						d->character->pcdata->pending= false;
				*/
			}

			read_from_buffer(d);
			if (d->incomm[0] != '\0')
			{
				d->fcommand = true;
				stop_idling(d->character);

				/* OLC */
				if (d->showstr_point)
				{
					show_string(d, d->incomm);
				}
				else if (d->pString)
				{
					string_add(d->character, d->incomm);
				}
				else if (d->connected == CON_PLAYING && d->character->pcdata && d->character->pcdata->entering_text)
				{
					process_text(d->character, d->incomm);
				}
				else
				{
					switch (d->connected)
					{
						case CON_PLAYING:
							if (!run_olc_editor(d))
								substitute_alias(d, d->incomm);
							break;
						default:
							nanny(d, d->incomm);
							break;
					}
				}
				/*		if (d->showstr_point)
							show_string(d,d->incomm);
						else if ( d->connected == CON_PLAYING && d->character->pcdata &&
				   d->character->pcdata->entering_text ) process_text(d->character, d->incomm); else if ( d->connected
				   == CON_PLAYING ) substitute_alias( d, d->incomm ); else nanny( d, d->incomm );
				*/
				d->incomm[0] = '\0';
			}
		}

		/*
		 * Autonomous game motion.
		 */
		update_handler();

		/*
		 * Output.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;

			if ((d->fcommand || d->outtop > 0) && FD_ISSET(d->descriptor, &out_set))
			{
				if (!process_output(d, true))
				{
					if (d->character != nullptr && d->character->level > 1)
						save_char_obj(d->character);

					d->outtop = 0;
					close_socket(d);
				}
			}
		}

		/*
		 * Synchronize to a clock.
		 * Sleep( last_time + 1/PULSE_PER_SECOND - now ).
		 * Careful here of signed versus unsigned arithmetic.
		 */
		{
			struct timeval now_time;
			long secDelta;
			long usecDelta;

			gettimeofday(&now_time, nullptr);

			usecDelta = ((int)last_time.tv_usec) - ((int)now_time.tv_usec) + 1000000 / PULSE_PER_SECOND;
			secDelta = ((int)last_time.tv_sec) - ((int)now_time.tv_sec);

			while (usecDelta < 0)
			{
				usecDelta += 1000000;
				secDelta -= 1;
			}

			while (usecDelta >= 1000000)
			{
				usecDelta -= 1000000;
				secDelta += 1;
			}

			if (secDelta > 0 || (secDelta == 0 && usecDelta > 0))
			{
				struct timeval stall_time;

				stall_time.tv_usec = usecDelta;
				stall_time.tv_sec = secDelta;

				if (select(0, nullptr, nullptr, nullptr, &stall_time) < 0)
				{
					RS.Logger.Error("Game_loop: select stall: {}", std::strerror(errno));
					exit(1);
				}
			}
		}

		gettimeofday(&last_time, nullptr);
		current_time = (time_t)last_time.tv_sec;
	}
}